

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

string * __thiscall
SetInstance::receive
          (string *__return_storage_ptr__,SetInstance *this,string *message_name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  bool bVar1;
  undefined8 *puVar2;
  
  bVar1 = std::operator==(message_name,"get");
  if (bVar1) {
    op_get(__return_storage_ptr__,this,arguments);
  }
  else {
    bVar1 = std::operator==(message_name,"isEmpty?");
    if (bVar1) {
      op_isEmpty(__return_storage_ptr__,this,arguments);
    }
    else {
      bVar1 = std::operator==(message_name,"contains?");
      if (bVar1) {
        op_contains(__return_storage_ptr__,this,arguments);
      }
      else {
        bVar1 = std::operator==(message_name,"size");
        if (bVar1) {
          op_size(__return_storage_ptr__,this,arguments);
        }
        else {
          bVar1 = std::operator==(message_name,"add:");
          if (bVar1) {
            op_add(__return_storage_ptr__,this,arguments);
          }
          else {
            bVar1 = std::operator==(message_name,"remove:");
            if (bVar1) {
              op_remove(__return_storage_ptr__,this,arguments);
            }
            else {
              bVar1 = std::operator==(message_name,"clear");
              if (!bVar1) {
                puVar2 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar2 = "RuntimeError: invalid message.";
                __cxa_throw(puVar2,&char_const*::typeinfo,0);
              }
              op_clear(__return_storage_ptr__,this,arguments);
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SetInstance::receive(const std::string& message_name, const std::vector<std::string>& arguments) {
    if (message_name == "get")
        return op_get(arguments);
    if (message_name == "isEmpty?")
        return op_isEmpty(arguments);
    if (message_name == "contains?")
        return op_contains(arguments);
    if (message_name == "size")
        return op_size(arguments);
    if (message_name == "add:")
        return op_add(arguments);
    if (message_name == "remove:")
        return op_remove(arguments);
    if (message_name == "clear")
        return op_clear(arguments);
    throw EXC_INVALID_MESSAGE;
}